

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_gcd(mbedtls_mpi *G,mbedtls_mpi *A,mbedtls_mpi *B)

{
  long lVar1;
  unsigned_short uVar2;
  int iVar3;
  mbedtls_mpi_uint *pmVar4;
  ulong uVar5;
  mbedtls_mpi *pmVar6;
  long lVar7;
  size_t sVar8;
  ulong count;
  mbedtls_mpi TA;
  mbedtls_mpi local_68;
  mbedtls_mpi local_58;
  mbedtls_mpi_uint local_48;
  mbedtls_mpi local_40;
  
  local_58.s = 1;
  local_58.n = 0;
  local_58.p = (ulong *)0x0;
  local_68.s = 1;
  local_68.n = 0;
  local_68.p = (ulong *)0x0;
  iVar3 = mbedtls_mpi_copy(&local_58,A);
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_copy(&local_68,B), iVar3 == 0)) {
    if (local_58.n != 0) {
      count = 0;
      lVar7 = 0;
      pmVar4 = local_58.p;
LAB_018876c0:
      uVar5 = *pmVar4;
      if (uVar5 == 0) goto code_r0x018876c8;
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      count = lVar1 - lVar7;
      goto LAB_018876e6;
    }
    count = 0;
LAB_018876e6:
    if (local_68.n != 0) {
      lVar7 = 0;
      pmVar4 = local_68.p;
LAB_018876fc:
      uVar5 = *pmVar4;
      if (uVar5 == 0) goto code_r0x01887704;
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar5 = lVar1 - lVar7;
      if (uVar5 == 0) {
LAB_0188771f:
        if ((*local_68.p & 1) != 0) {
          uVar5 = 0;
          goto LAB_01887782;
        }
        goto LAB_0188772a;
      }
LAB_01887782:
      if (uVar5 < count) {
        count = uVar5;
      }
      local_68.s = 1;
      local_58.s = 1;
LAB_018877bc:
      local_40.s = 1;
      local_40.n = 1;
      local_48 = 0;
      local_40.p = &local_48;
      iVar3 = mbedtls_mpi_cmp_mpi(&local_58,&local_40);
      if (iVar3 == 0) {
        iVar3 = mbedtls_mpi_shift_l(&local_68,count);
        A = &local_68;
        if (iVar3 != 0) goto LAB_0188772f;
        goto LAB_0188772a;
      }
      if ((ulong)local_58.n != 0) {
        lVar7 = 0;
        pmVar4 = local_58.p;
LAB_018877e2:
        uVar5 = *pmVar4;
        if (uVar5 == 0) goto code_r0x018877ea;
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        sVar8 = lVar1 - lVar7;
        goto LAB_01887805;
      }
      goto LAB_0188780a;
    }
LAB_0188772a:
    iVar3 = mbedtls_mpi_copy(G,A);
  }
LAB_0188772f:
  if (local_58.p != (ulong *)0x0) {
    mbedtls_zeroize_and_free(local_58.p,(ulong)local_58.n << 3);
  }
  local_58.s = 1;
  local_58.n = 0;
  local_58.p = (mbedtls_mpi_uint *)0x0;
  if (local_68.p != (ulong *)0x0) {
    mbedtls_zeroize_and_free(local_68.p,(ulong)local_68.n << 3);
  }
  return iVar3;
code_r0x018876c8:
  lVar7 = lVar7 + -0x40;
  pmVar4 = pmVar4 + 1;
  if ((ulong)local_58.n * 0x40 + lVar7 == 0) goto LAB_018876e6;
  goto LAB_018876c0;
code_r0x01887704:
  lVar7 = lVar7 + -0x40;
  pmVar4 = pmVar4 + 1;
  if ((ulong)local_68.n * 0x40 + lVar7 == 0) goto LAB_0188771f;
  goto LAB_018876fc;
code_r0x018877ea:
  lVar7 = lVar7 + -0x40;
  pmVar4 = pmVar4 + 1;
  if ((ulong)local_58.n * 0x40 + lVar7 == 0) goto code_r0x018877fa;
  goto LAB_018877e2;
code_r0x018877fa:
  sVar8 = 0;
LAB_01887805:
  mbedtls_mpi_core_shift_r(local_58.p,(ulong)local_58.n,sVar8);
LAB_0188780a:
  if ((ulong)local_68.n != 0) {
    lVar7 = 0;
    pmVar4 = local_68.p;
LAB_01887822:
    uVar5 = *pmVar4;
    if (uVar5 == 0) goto code_r0x0188782a;
    lVar1 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    sVar8 = lVar1 - lVar7;
    goto LAB_01887845;
  }
LAB_0188784a:
  iVar3 = mbedtls_mpi_cmp_mpi(&local_58,&local_68);
  if (iVar3 < 0) {
    iVar3 = mbedtls_mpi_sub_abs(&local_68,&local_68,&local_58);
    if (iVar3 != 0) goto LAB_0188772f;
    pmVar6 = &local_68;
    uVar2 = local_68.n;
  }
  else {
    iVar3 = mbedtls_mpi_sub_abs(&local_58,&local_58,&local_68);
    pmVar6 = &local_58;
    uVar2 = local_58.n;
    if (iVar3 != 0) goto LAB_0188772f;
  }
  if (uVar2 != 0) {
    mbedtls_mpi_core_shift_r(pmVar6->p,(ulong)uVar2,1);
  }
  goto LAB_018877bc;
code_r0x0188782a:
  lVar7 = lVar7 + -0x40;
  pmVar4 = pmVar4 + 1;
  if ((ulong)local_68.n * 0x40 + lVar7 == 0) goto code_r0x0188783a;
  goto LAB_01887822;
code_r0x0188783a:
  sVar8 = 0;
LAB_01887845:
  mbedtls_mpi_core_shift_r(local_68.p,(ulong)local_68.n,sVar8);
  goto LAB_0188784a;
}

Assistant:

int mbedtls_mpi_gcd(mbedtls_mpi *G, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t lz, lzt;
    mbedtls_mpi TA, TB;

    mbedtls_mpi_init(&TA); mbedtls_mpi_init(&TB);

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B));

    lz = mbedtls_mpi_lsb(&TA);
    lzt = mbedtls_mpi_lsb(&TB);

    /* The loop below gives the correct result when A==0 but not when B==0.
     * So have a special case for B==0. Leverage the fact that we just
     * calculated the lsb and lsb(B)==0 iff B is odd or 0 to make the test
     * slightly more efficient than cmp_int(). */
    if (lzt == 0 && mbedtls_mpi_get_bit(&TB, 0) == 0) {
        ret = mbedtls_mpi_copy(G, A);
        goto cleanup;
    }

    if (lzt < lz) {
        lz = lzt;
    }

    TA.s = TB.s = 1;

    /* We mostly follow the procedure described in HAC 14.54, but with some
     * minor differences:
     * - Sequences of multiplications or divisions by 2 are grouped into a
     *   single shift operation.
     * - The procedure in HAC assumes that 0 < TB <= TA.
     *     - The condition TB <= TA is not actually necessary for correctness.
     *       TA and TB have symmetric roles except for the loop termination
     *       condition, and the shifts at the beginning of the loop body
     *       remove any significance from the ordering of TA vs TB before
     *       the shifts.
     *     - If TA = 0, the loop goes through 0 iterations and the result is
     *       correctly TB.
     *     - The case TB = 0 was short-circuited above.
     *
     * For the correctness proof below, decompose the original values of
     * A and B as
     *   A = sa * 2^a * A' with A'=0 or A' odd, and sa = +-1
     *   B = sb * 2^b * B' with B'=0 or B' odd, and sb = +-1
     * Then gcd(A, B) = 2^{min(a,b)} * gcd(A',B'),
     * and gcd(A',B') is odd or 0.
     *
     * At the beginning, we have TA = |A| and TB = |B| so gcd(A,B) = gcd(TA,TB).
     * The code maintains the following invariant:
     *     gcd(A,B) = 2^k * gcd(TA,TB) for some k   (I)
     */

    /* Proof that the loop terminates:
     * At each iteration, either the right-shift by 1 is made on a nonzero
     * value and the nonnegative integer bitlen(TA) + bitlen(TB) decreases
     * by at least 1, or the right-shift by 1 is made on zero and then
     * TA becomes 0 which ends the loop (TB cannot be 0 if it is right-shifted
     * since in that case TB is calculated from TB-TA with the condition TB>TA).
     */
    while (mbedtls_mpi_cmp_int(&TA, 0) != 0) {
        /* Divisions by 2 preserve the invariant (I). */
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TA, mbedtls_mpi_lsb(&TA)));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TB, mbedtls_mpi_lsb(&TB)));

        /* Set either TA or TB to |TA-TB|/2. Since TA and TB are both odd,
         * TA-TB is even so the division by 2 has an integer result.
         * Invariant (I) is preserved since any odd divisor of both TA and TB
         * also divides |TA-TB|/2, and any odd divisor of both TA and |TA-TB|/2
         * also divides TB, and any odd divisor of both TB and |TA-TB|/2 also
         * divides TA.
         */
        if (mbedtls_mpi_cmp_mpi(&TA, &TB) >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(&TA, &TA, &TB));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TA, 1));
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(&TB, &TB, &TA));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TB, 1));
        }
        /* Note that one of TA or TB is still odd. */
    }

    /* By invariant (I), gcd(A,B) = 2^k * gcd(TA,TB) for some k.
     * At the loop exit, TA = 0, so gcd(TA,TB) = TB.
     * - If there was at least one loop iteration, then one of TA or TB is odd,
     *   and TA = 0, so TB is odd and gcd(TA,TB) = gcd(A',B'). In this case,
     *   lz = min(a,b) so gcd(A,B) = 2^lz * TB.
     * - If there was no loop iteration, then A was 0, and gcd(A,B) = B.
     *   In this case, lz = 0 and B = TB so gcd(A,B) = B = 2^lz * TB as well.
     */

    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&TB, lz));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(G, &TB));

cleanup:

    mbedtls_mpi_free(&TA); mbedtls_mpi_free(&TB);

    return ret;
}